

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::GetToolset
          (cmGlobalGhsMultiGenerator *this,cmMakefile *mf,string *tsp,string *ts)

{
  bool bVar1;
  string *psVar2;
  string tryPath;
  string msg;
  string root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tryPath,"GHS_TOOLSET_ROOT",(allocator<char> *)&msg);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&tryPath);
  std::__cxx11::string::string((string *)&root,(string *)psVar2);
  std::__cxx11::string::~string((string *)&tryPath);
  if (ts->_M_string_length == 0) {
    output.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    output.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    output.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = cmsys::SystemTools::PathExists(&root);
    if (bVar1) {
      if (root._M_dataplus._M_p[root._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)&root);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tryPath,"comp_[^;]+",(allocator<char> *)&msg);
      cmSystemTools::Glob(&root,&tryPath,&output);
      std::__cxx11::string::~string((string *)&tryPath);
      if (output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&msg,"No GHS toolsets found in GHS_TOOLSET_ROOT \"",&root);
        std::operator+(&tryPath,&msg,"\".");
        std::__cxx11::string::~string((string *)&msg);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&tryPath);
        std::__cxx11::string::assign((char *)tsp);
      }
      else {
        std::operator+(&tryPath,&root,
                       output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::__cxx11::string::operator=((string *)tsp,(string *)&tryPath);
      }
    }
    else {
      std::operator+(&msg,"GHS_TOOLSET_ROOT directory \"",&root);
      std::operator+(&tryPath,&msg,"\" does not exist.");
      std::__cxx11::string::~string((string *)&msg);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&tryPath);
      std::__cxx11::string::assign((char *)tsp);
    }
    std::__cxx11::string::~string((string *)&tryPath);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&output);
  }
  else {
    tryPath._M_dataplus._M_p = (pointer)&tryPath.field_2;
    tryPath._M_string_length = 0;
    tryPath.field_2._M_local_buf[0] = '\0';
    cmsys::SystemTools::CollapseFullPath(&msg,ts,&root);
    std::__cxx11::string::operator=((string *)&tryPath,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    bVar1 = cmsys::SystemTools::FileExists(&tryPath);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)tsp);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                     "GHS toolset \"",&tryPath);
      std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &output,"\" does not exist.");
      std::__cxx11::string::~string((string *)&output);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&msg);
      std::__cxx11::string::assign((char *)tsp);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::__cxx11::string::~string((string *)&tryPath);
  }
  std::__cxx11::string::~string((string *)&root);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetToolset(cmMakefile* mf, std::string& tsp,
                                           const std::string& ts)
{
  /* Determine tsp - full path of the toolset from ts (toolset hint via -T) */

  std::string root = mf->GetSafeDefinition("GHS_TOOLSET_ROOT");

  // Check if `-T` was set by user
  if (ts.empty()) {
    // Enter toolset search mode
    std::vector<std::string> output;

    // Make sure root exists...
    if (!cmSystemTools::PathExists(root)) {
      std::string msg =
        "GHS_TOOLSET_ROOT directory \"" + root + "\" does not exist.";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
      return;
    }

    // Add a directory separator
    if (root.back() != '/') {
      root += "/";
    }

    // Get all compiler directories in toolset root
    cmSystemTools::Glob(root, "comp_[^;]+", output);

    if (output.empty()) {
      // No compiler directories found
      std::string msg =
        "No GHS toolsets found in GHS_TOOLSET_ROOT \"" + root + "\".";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
    } else {
      // Use latest? version
      tsp = root + output.back();
    }

  } else {
    // Toolset was provided by user
    std::string tryPath;

    // NOTE: CollapseFullPath() will determine if user toolset was full path or
    //       or relative path.
    tryPath = cmSystemTools::CollapseFullPath(ts, root);
    if (!cmSystemTools::FileExists(tryPath)) {
      std::string msg = "GHS toolset \"" + tryPath + "\" does not exist.";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
    } else {
      tsp = tryPath;
    }
  }
}